

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  uint uVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  stbi_uc sVar5;
  stbi_uc *psVar6;
  undefined1 local_4888 [8];
  stbi__jpeg j;
  
  local_4888 = (undefined1  [8])s;
  iVar1 = stbi__decode_jpeg_header((stbi__jpeg *)local_4888,2);
  if (iVar1 == 0) {
    *(stbi_uc **)((long)local_4888 + 0xb8) = *(stbi_uc **)((long)local_4888 + 200);
    local_4888 = (undefined1  [8])s;
    iVar1 = stbi__parse_png_file((stbi__png *)local_4888,2,0);
    if (iVar1 == 0) {
      *(stbi_uc **)((long)local_4888 + 0xb8) = *(stbi_uc **)((long)local_4888 + 200);
      iVar1 = stbi__gif_header(s,(stbi__gif *)local_4888,comp,1);
      if (iVar1 != 0) {
        if (x != (int *)0x0) {
          *x = local_4888._0_4_;
        }
        if (y == (int *)0x0) {
          return 1;
        }
        *y = local_4888._4_4_;
        return 1;
      }
      psVar4 = s->img_buffer_original;
      s->img_buffer = psVar4;
      psVar3 = s->img_buffer_end;
      if (psVar4 < psVar3) {
        psVar6 = psVar4 + 1;
        s->img_buffer = psVar6;
        sVar5 = *psVar4;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0010ed70;
        psVar4 = s->buffer_start;
        iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
        if (iVar1 == 0) {
          s->read_from_callbacks = 0;
          psVar3 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar5 = '\0';
        }
        else {
          psVar3 = psVar4 + iVar1;
          sVar5 = *psVar4;
        }
        s->img_buffer_end = psVar3;
        psVar6 = s->buffer_start + 1;
        s->img_buffer = psVar6;
      }
      if (sVar5 != 'B') goto LAB_0010ed70;
      if (psVar6 < psVar3) {
        psVar4 = psVar6 + 1;
        s->img_buffer = psVar4;
        sVar5 = *psVar6;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0010ed70;
        psVar4 = s->buffer_start;
        iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
        if (iVar1 == 0) {
          s->read_from_callbacks = 0;
          psVar3 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar5 = '\0';
        }
        else {
          psVar3 = psVar4 + iVar1;
          sVar5 = *psVar4;
        }
        s->img_buffer_end = psVar3;
        psVar4 = s->buffer_start + 1;
      }
      if (sVar5 != 'M') goto LAB_0010ed70;
      if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
         (iVar1 = (int)psVar3 - (int)psVar4, 0xb < iVar1)) {
        s->img_buffer = psVar4 + 0xc;
      }
      else {
        s->img_buffer = psVar3;
        (*(s->io).skip)(s->io_user_data,0xc - iVar1);
      }
      uVar2 = stbi__get16le(s);
      iVar1 = stbi__get16le(s);
      uVar2 = iVar1 << 0x10 | uVar2;
      if ((int)uVar2 < 0x38) {
        if (uVar2 != 0xc) {
          if (uVar2 != 0x28) goto LAB_0010ed70;
          goto LAB_0010ed1b;
        }
        iVar1 = stbi__get16le(s);
        *x = iVar1;
        uVar2 = stbi__get16le(s);
      }
      else {
        if (((uVar2 != 0x38) && (uVar2 != 0x6c)) && (uVar2 != 0x7c)) goto LAB_0010ed70;
LAB_0010ed1b:
        uVar2 = stbi__get16le(s);
        iVar1 = stbi__get16le(s);
        *x = iVar1 << 0x10 | uVar2;
        uVar2 = stbi__get16le(s);
        iVar1 = stbi__get16le(s);
        uVar2 = iVar1 << 0x10 | uVar2;
      }
      *y = uVar2;
      iVar1 = stbi__get16le(s);
      if (iVar1 != 1) {
LAB_0010ed70:
        s->img_buffer = s->img_buffer_original;
        iVar1 = stbi__psd_info(s,x,y,comp);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = stbi__pic_info(s,x,y,comp);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = stbi__pnm_info(s,x,y,comp);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = stbi__hdr_info(s,x,y,comp);
        if (iVar1 == 0) {
          iVar1 = stbi__tga_info(s,x,y,comp);
          if (iVar1 == 0) {
            stbi__g_failure_reason = "unknown image type";
            return 0;
          }
          return 1;
        }
        return 1;
      }
      uVar2 = stbi__get16le(s);
      uVar2 = uVar2 >> 3;
      goto LAB_0010eb39;
    }
  }
  if (x != (int *)0x0) {
    *x = *(stbi__uint32 *)local_4888;
  }
  if (y != (int *)0x0) {
    *y = *(stbi__uint32 *)((long)local_4888 + 4);
  }
  if (comp == (int *)0x0) {
    return 1;
  }
  uVar2 = *(int *)((long)local_4888 + 8);
LAB_0010eb39:
  *comp = uVar2;
  return 1;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}